

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O2

void LoadObjects(Level *NewLev)

{
  byte *pbVar1;
  ObjectType *pOVar2;
  int iVar3;
  int iVar4;
  Object *pOVar5;
  TokenTypes TVar6;
  ObjectType **ppOVar7;
  
  ExpectToken(TK_OPENBRACE);
  do {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
LAB_0010d462:
        Error = 1;
      }
      return;
    }
    pOVar5 = NewObject();
    NewLev->TotalObjects = NewLev->TotalObjects + 1;
    ExpectToken(TK_NUMBER);
    pOVar5->Pos[0] = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    pOVar5->Pos[1] = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    pOVar5->Angle = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    if (Token.IQuantity < 0) {
      pOVar5->ObjType = &NewLev->Door;
      *(byte *)&pOVar5->Flags = (byte)pOVar5->Flags | 2;
      NewLev->TotalObjects = NewLev->TotalObjects + -1;
    }
    else {
      ppOVar7 = &NewLev->AllObjectTypes;
      iVar4 = Token.IQuantity + -1;
      do {
        iVar3 = iVar4;
        pOVar2 = *ppOVar7;
        pOVar5->ObjType = pOVar2;
        if (pOVar2 == (ObjectType *)0x0) {
          Error = 1;
          snprintf(ErrorText,0x400,"Unknown object referenced at line %d",(ulong)(uint)Lines);
          return;
        }
        ppOVar7 = &pOVar2->Next;
        iVar4 = iVar3 + -1;
        Token.IQuantity = iVar3;
      } while (iVar3 + -1 != -2);
    }
    GetToken();
    if (Token.Type != TK_CLOSEBRACE) {
      if (Token.Type == TK_COMMA) {
        do {
          TVar6 = TK_OPENBRACE;
          do {
            do {
              if (TVar6 != TK_OPENBRACE) goto LAB_0010d407;
              GetToken();
              TVar6 = Token.Type;
            } while (Token.Type == TK_CLOSEBRACE);
            if (Token.Type != TK_STRING) goto LAB_0010d462;
            iVar4 = bcmp(Token.Text,"collidable",0xb);
            if (iVar4 == 0) {
              pbVar1 = (byte *)((long)&pOVar5->Flags + 1);
              *pbVar1 = *pbVar1 | 1;
            }
            iVar4 = bcmp(Token.Text,"foreground",0xb);
            TVar6 = TK_OPENBRACE;
          } while (iVar4 != 0);
          pbVar1 = (byte *)((long)&pOVar5->Flags + 1);
          *pbVar1 = *pbVar1 | 2;
        } while( true );
      }
      goto LAB_0010d462;
    }
LAB_0010d407:
    pOVar5->Next = NewLev->AllObjects;
    NewLev->AllObjects = pOVar5;
  } while( true );
}

Assistant:

void LoadObjects(struct Level *NewLev)
{
   struct Object *Obj;
   int Finished;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Obj = NewObject();
               NewLev->TotalObjects++;

               /* read location */
               ExpectToken(TK_NUMBER);
               Obj->Pos[0] = Token.FQuantity;
               ExpectToken(TK_COMMA);
               ExpectToken(TK_NUMBER);
               Obj->Pos[1] = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read angle, convert into Allegro format */
               ExpectToken(TK_NUMBER);
               Obj->Angle = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read object type, manipulate pointer */
               ExpectToken(TK_NUMBER);
               if (Token.IQuantity >= 0) {
                  Obj->ObjType = NewLev->AllObjectTypes;
                  while (Obj->ObjType && Token.IQuantity--)
                     Obj->ObjType = Obj->ObjType->Next;

                  if (Token.IQuantity != -1) {
                     Error = 1;
                     snprintf(ErrorText, sizeof(ErrorText),
                               "Unknown object referenced at line %d", Lines);
                     return;
                  }
               } else {
                  /* this is the door - a hard coded type */
                  Obj->ObjType = &NewLev->Door;
                  Obj->Flags |= OBJFLAGS_DOOR;
                  NewLev->TotalObjects--;
               }

               /* parse any flags that may exist */
               GetToken();
               switch (Token.Type) {
                  case TK_COMMA:
                     {
                        Finished = false;
                        while (!Finished) {
                           GetToken();
                           switch (Token.Type) {
                              case TK_CLOSEBRACE:
                                 Finished = true;
                                 break;
                              case TK_STRING:
                                 if (!strcmp(Token.Text, "collidable"))
                                    Obj->Flags |= FLAGS_COLLIDABLE;
                                 if (!strcmp(Token.Text, "foreground"))
                                    Obj->Flags |= FLAGS_FOREGROUND;
                                 break;
                              default:
                                 Error = 1;
                                 return;
                           }
                        }
                     }
                     break;
                  case TK_CLOSEBRACE:
                     break;
                  default:
                     Error = 1;
                     return;
               }

               /* thread into list */
               Obj->Next = NewLev->AllObjects;
               NewLev->AllObjects = Obj;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}